

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O1

void decompress(char *buffer_out)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  long lVar13;
  bool bVar14;
  
  iVar4 = 0;
  iVar5 = 0;
  iVar8 = 0;
  do {
    iVar9 = iVar4 + iVar8 * 4 + 4;
    iVar4 = *(int *)(data + (long)iVar4 + (long)iVar8 * 4);
    iVar1 = iVar4 + iVar9;
    do {
      iVar6 = iVar9 + 1;
      bVar2 = data[iVar9];
      if (bVar2 < 0x10) {
LAB_001046da:
        iVar9 = iVar6 + 2;
        uVar10 = (bVar2 & 0xf) + 4;
        if (uVar10 == 0x13) {
          pbVar12 = data + iVar9;
          uVar10 = 0x13;
          do {
            bVar2 = *pbVar12;
            uVar10 = uVar10 + bVar2;
            pbVar12 = pbVar12 + 1;
            iVar9 = iVar9 + 1;
          } while (bVar2 == 0xff);
        }
        iVar7 = iVar5 - (uint)*(ushort *)(data + iVar6);
        if (*(ushort *)(data + iVar6) < 4) {
          bVar14 = true;
          if (uVar10 != 0) {
            lVar13 = 0;
            do {
              buffer_out[lVar13 + iVar5] = buffer_out[lVar13 + iVar7];
              lVar13 = lVar13 + 1;
            } while (uVar10 != (uint)lVar13);
            iVar5 = iVar5 + (uint)lVar13;
          }
        }
        else {
          *(undefined4 *)(buffer_out + iVar5) = *(undefined4 *)(buffer_out + iVar7);
          if (4 < (int)uVar10) {
            uVar11 = 4;
            do {
              *(undefined4 *)(buffer_out + uVar11 + (long)iVar5) =
                   *(undefined4 *)(buffer_out + uVar11 + (long)iVar7);
              uVar11 = uVar11 + 4;
            } while (uVar11 < uVar10);
          }
          iVar5 = iVar5 + uVar10;
          bVar14 = true;
        }
      }
      else {
        uVar10 = (uint)(bVar2 >> 4);
        if (uVar10 == 0xf) {
          pbVar12 = data + iVar6;
          uVar10 = 0xf;
          do {
            bVar3 = *pbVar12;
            uVar10 = uVar10 + bVar3;
            pbVar12 = pbVar12 + 1;
            iVar6 = iVar6 + 1;
          } while (bVar3 == 0xff);
        }
        *(undefined4 *)(buffer_out + iVar5) = *(undefined4 *)(data + iVar6);
        if (4 < (int)uVar10) {
          uVar11 = 4;
          do {
            *(undefined4 *)(buffer_out + uVar11 + (long)iVar5) =
                 *(undefined4 *)(data + (long)iVar6 + uVar11);
            uVar11 = uVar11 + 4;
          } while (uVar11 < uVar10);
        }
        iVar5 = iVar5 + uVar10;
        iVar9 = iVar6 + uVar10;
        bVar14 = iVar9 < iVar1;
        iVar6 = iVar9;
        if (iVar9 < iVar1) goto LAB_001046da;
      }
    } while (bVar14);
    bVar14 = iVar8 != 0;
    iVar8 = iVar8 + 1;
    if (bVar14) {
      return;
    }
  } while( true );
}

Assistant:

void decompress(char* buffer_out) {
	int blockLength = 0;
    int p = 0;                                  //指向当前输出缓冲区的位置
	for(int i = 0; i < 2; i++) {
        int und_p = 4 * (i + 1) + blockLength;  //指向当前待解压区的位置
        blockLength = *((unsigned int*) (&data[4 * i + blockLength]));
		int und_end = und_p + blockLength;	    //待解压区的结束位置

		while (1) {
			int token = data[und_p++];

			//如果token中字面值长度是有的
			if (token >= 16) {
				int literalLength = token >> 4;    //字面值长度

				if (literalLength == 15) {
					//字面值长度大于等于15就接着去扩展区获取
					while (1) {
						int c = data[und_p++];
						literalLength += c;

						if (c != 255)
							break;
					}
				}

				//复制字面的字符
				copyToDestination(buffer_out, p, data, und_p, literalLength);

				//挪动当前位置指向和待压缩区位置指向
				p += literalLength;
				und_p += literalLength;

				//如果复制完字面字符已经到底了就退出
				if (und_p >= und_end)
					break;
			}

			//获取匹配字符串在的位置
			int ago_p = p - (*((unsigned short*)(&data[und_p])));
			und_p += 2;

			//获取token里的匹配长度
			int matchLength = (token & 15) + 4;

			if (matchLength == 15 + 4) {
				//如果有扩展长度就获取扩展的匹配长度
				while (1) {
					int c = data[und_p++];
					matchLength += c;

					if (c != 255)
						break;
				}
			}

			//偏移大于等于4可以大胆整块复制
			if (p - ago_p >= 4) {
				copyToDestination(buffer_out, p, (unsigned char*) buffer_out, ago_p, matchLength);
				p += matchLength;
			}
			else {
				//否则一个个字符复制
				while (matchLength-- != 0)
					buffer_out[p++] = buffer_out[ago_p++];
			}
		}
	}
}